

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowererMDArch.cpp
# Opt level: O0

Instr * __thiscall
LowererMDArch::LowerEHRegionReturn(LowererMDArch *this,Instr *insertBeforeInstr,Opnd *targetOpnd)

{
  RegNum reg;
  StackSym *sym;
  RegOpnd *dstOpnd;
  Instr *pIVar1;
  RegOpnd *pRVar2;
  HelperCallOpnd *src1Opnd;
  IntConstOpnd *newSrc;
  Instr *retInstr;
  IntConstOpnd *intSrc;
  Instr *push;
  Instr *movTarget;
  Opnd *endCallWithFakeFrame;
  Instr *movArgsSize;
  Instr *movSpillSize;
  RegOpnd *retReg;
  Opnd *targetOpnd_local;
  Instr *insertBeforeInstr_local;
  LowererMDArch *this_local;
  
  sym = StackSym::New(TyInt64,this->m_func);
  reg = GetRegReturn(TyInt64);
  dstOpnd = IR::RegOpnd::New(sym,reg,TyInt64,this->m_func);
  pIVar1 = IR::Instr::New(MOV,&dstOpnd->super_Opnd,targetOpnd,this->m_func);
  IR::Instr::InsertBefore(insertBeforeInstr,pIVar1);
  pRVar2 = IR::RegOpnd::New((StackSym *)0x0,RegArg2,TyInt64,this->m_func);
  pIVar1 = IR::Instr::New(LdSpillSize,&pRVar2->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(insertBeforeInstr,pIVar1);
  pRVar2 = IR::RegOpnd::New((StackSym *)0x0,RegArg3,TyInt64,this->m_func);
  pIVar1 = IR::Instr::New(LdArgSize,&pRVar2->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(insertBeforeInstr,pIVar1);
  pRVar2 = IR::RegOpnd::New((StackSym *)0x0,RegArg0,TyInt64,this->m_func);
  src1Opnd = IR::HelperCallOpnd::New(HelperOp_ReturnFromCallWithFakeFrame,this->m_func);
  pIVar1 = IR::Instr::New(MOV,&pRVar2->super_Opnd,&src1Opnd->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(insertBeforeInstr,pIVar1);
  pIVar1 = IR::Instr::New(PUSH,this->m_func);
  IR::Instr::SetSrc1(pIVar1,&pRVar2->super_Opnd);
  IR::Instr::InsertBefore(insertBeforeInstr,pIVar1);
  newSrc = IR::IntConstOpnd::New(0,TyInt32,this->m_func,false);
  pIVar1 = IR::Instr::New(RET,this->m_func);
  IR::Instr::SetSrc1(pIVar1,&newSrc->super_Opnd);
  IR::Instr::SetSrc2(pIVar1,&dstOpnd->super_Opnd);
  IR::Instr::InsertBefore(insertBeforeInstr,pIVar1);
  return pIVar1;
}

Assistant:

IR::Instr *
LowererMDArch::LowerEHRegionReturn(IR::Instr * insertBeforeInstr, IR::Opnd * targetOpnd)
{
    IR::RegOpnd *retReg = IR::RegOpnd::New(StackSym::New(TyMachReg, this->m_func), GetRegReturn(TyMachReg), TyMachReg, this->m_func);

    // Load the continuation address into the return register.
    insertBeforeInstr->InsertBefore(IR::Instr::New(Js::OpCode::MOV, retReg, targetOpnd, this->m_func));

    // MOV REG_EH_SPILL_SIZE, spillSize
    IR::Instr *movSpillSize = IR::Instr::New(Js::OpCode::LdSpillSize,
        IR::RegOpnd::New(nullptr, REG_EH_SPILL_SIZE, TyMachReg, m_func),
        m_func);
    insertBeforeInstr->InsertBefore(movSpillSize);


    // MOV REG_EH_ARGS_SIZE, argsSize
    IR::Instr *movArgsSize = IR::Instr::New(Js::OpCode::LdArgSize,
        IR::RegOpnd::New(nullptr, REG_EH_ARGS_SIZE, TyMachReg, m_func),
        m_func);
    insertBeforeInstr->InsertBefore(movArgsSize);

    // MOV REG_EH_TARGET, amd64_ReturnFromCallWithFakeFrame
    // PUSH REG_EH_TARGET
    // RET
    IR::Opnd *endCallWithFakeFrame = endCallWithFakeFrame =
        IR::RegOpnd::New(nullptr, REG_EH_TARGET, TyMachReg, m_func);
    IR::Instr *movTarget = IR::Instr::New(Js::OpCode::MOV,
        endCallWithFakeFrame,
        IR::HelperCallOpnd::New(IR::HelperOp_ReturnFromCallWithFakeFrame, m_func),
        m_func);
    insertBeforeInstr->InsertBefore(movTarget);

    IR::Instr *push = IR::Instr::New(Js::OpCode::PUSH, m_func);
    push->SetSrc1(endCallWithFakeFrame);
    insertBeforeInstr->InsertBefore(push);

#if 0
        // TODO: This block gets deleted if we emit a JMP instead of a RET.
    IR::BranchInstr *jmp = IR::BranchInstr::New(Js::OpCode::JMP,
        nullptr,
        targetOpnd,
        m_func);
    leaveInstr->InsertBefore(jmp);
#endif

    IR::IntConstOpnd *intSrc = IR::IntConstOpnd::New(0, TyInt32, this->m_func);
    IR::Instr * retInstr = IR::Instr::New(Js::OpCode::RET, this->m_func);
    retInstr->SetSrc1(intSrc);
    retInstr->SetSrc2(retReg);
    insertBeforeInstr->InsertBefore(retInstr);

    // return the last instruction inserted
    return retInstr;
}